

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorKeyReference::DescriptorKeyReference
          (DescriptorKeyReference *this,Pubkey *pubkey)

{
  SchnorrPubkey local_40;
  Pubkey *local_18;
  Pubkey *pubkey_local;
  DescriptorKeyReference *this_local;
  
  this->key_type_ = kDescriptorKeyPublic;
  local_18 = pubkey;
  pubkey_local = (Pubkey *)this;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  Pubkey::Pubkey(&this->pubkey_,local_18);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  KeyData::KeyData(&this->key_data_);
  ::std::__cxx11::string::string((string *)&this->argument_);
  SchnorrPubkey::FromPubkey(&local_40,&this->pubkey_,(bool *)0x0);
  SchnorrPubkey::operator=(&this->schnorr_pubkey_,&local_40);
  SchnorrPubkey::~SchnorrPubkey(&local_40);
  return;
}

Assistant:

DescriptorKeyReference::DescriptorKeyReference(const Pubkey& pubkey)
    : key_type_(DescriptorKeyType::kDescriptorKeyPublic), pubkey_(pubkey) {
  schnorr_pubkey_ = SchnorrPubkey::FromPubkey(pubkey_);
}